

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

string * __thiscall
cmOutputConverter::EscapeForShell
          (string *__return_storage_ptr__,cmOutputConverter *this,string *str,bool makeVars,
          bool forEcho,bool useWatcomQuote)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  const_iterator cVar6;
  cmState *pcVar7;
  uint flags;
  undefined3 in_register_00000089;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000089,useWatcomQuote);
  if (cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_ ==
      '\0') {
    EscapeForShell();
  }
  if (cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_.
      _40_8_ == 0) {
    paVar1 = &local_58.field_2;
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3c;
    local_58._M_string_length = 1;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3e;
    local_58._M_string_length = 1;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3c3c;
    local_58._M_string_length = 2;
    local_58.field_2._M_local_buf[2] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3e3e;
    local_58._M_string_length = 2;
    local_58.field_2._M_local_buf[2] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x7c;
    local_58._M_string_length = 1;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x7c7c;
    local_58._M_string_length = 2;
    local_58.field_2._M_local_buf[2] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x2626;
    local_58._M_string_length = 2;
    local_58.field_2._M_local_buf[2] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3e26;
    local_58._M_string_length = 2;
    local_58.field_2._M_local_buf[2] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3e31;
    local_58._M_string_length = 2;
    local_58.field_2._M_local_buf[2] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3e32;
    local_58._M_string_length = 2;
    local_58.field_2._M_local_buf[2] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3e32;
    local_58.field_2._M_local_buf[2] = '&';
    local_58.field_2._M_local_buf[3] = '1';
    local_58._M_string_length = 4;
    local_58.field_2._M_allocated_capacity._4_4_ =
         local_58.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3e31;
    local_58.field_2._M_local_buf[2] = '&';
    local_58.field_2._M_local_buf[3] = '2';
    local_58._M_string_length = 4;
    local_58.field_2._M_allocated_capacity._4_4_ =
         local_58.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_58.field_2._M_local_buf[3],
                                        CONCAT12(local_58.field_2._M_local_buf[2],
                                                 local_58.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
  }
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                    shellOperators_abi_cxx11_,str);
  if (cVar6._M_node ==
      (_Base_ptr)
      (cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_ + 8)
     ) {
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar4 = cmState::UseWindowsVSIDE(pcVar7);
    uVar5 = 2;
    if (!bVar4) {
      uVar5 = this->LinkScriptShell ^ 1;
    }
    flags = uVar5 | 0x40;
    if (!makeVars) {
      flags = uVar5;
    }
    uVar5 = flags | 4;
    if (!forEcho) {
      uVar5 = flags;
    }
    uVar3 = uVar5 | 0x80;
    if ((char)local_34 == '\0') {
      uVar3 = uVar5;
    }
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar4 = cmState::UseWatcomWMake(pcVar7);
    uVar5 = uVar3 | 8;
    if (!bVar4) {
      uVar5 = uVar3;
    }
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar4 = cmState::UseMinGWMake(pcVar7);
    uVar3 = uVar5 | 0x10;
    if (!bVar4) {
      uVar3 = uVar5;
    }
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar4 = cmState::UseNMake(pcVar7);
    uVar5 = uVar3 | 0x20;
    if (!bVar4) {
      uVar5 = uVar3;
    }
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar4 = cmState::UseWindowsShell(pcVar7);
    uVar3 = uVar5 | 0x100;
    if (bVar4) {
      uVar3 = uVar5;
    }
    Shell__GetArgument_abi_cxx11_
              (__return_storage_ptr__,(cmOutputConverter *)(str->_M_dataplus)._M_p,
               (char *)(ulong)uVar3,flags);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(const std::string& str,
                                              bool makeVars, bool forEcho,
                                              bool useWatcomQuote) const
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return str;
  }

  // Compute the flags for the target shell environment.
  int flags = 0;
  if (this->GetState()->UseWindowsVSIDE()) {
    flags |= Shell_Flag_VSIDE;
  } else if (!this->LinkScriptShell) {
    flags |= Shell_Flag_Make;
  }
  if (makeVars) {
    flags |= Shell_Flag_AllowMakeVariables;
  }
  if (forEcho) {
    flags |= Shell_Flag_EchoWindows;
  }
  if (useWatcomQuote) {
    flags |= Shell_Flag_WatcomQuote;
  }
  if (this->GetState()->UseWatcomWMake()) {
    flags |= Shell_Flag_WatcomWMake;
  }
  if (this->GetState()->UseMinGWMake()) {
    flags |= Shell_Flag_MinGWMake;
  }
  if (this->GetState()->UseNMake()) {
    flags |= Shell_Flag_NMake;
  }
  if (!this->GetState()->UseWindowsShell()) {
    flags |= Shell_Flag_IsUnix;
  }

  return Shell__GetArgument(str.c_str(), flags);
}